

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

int ltf8_decode(cram_fd *fd,int64_t *val_p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  byte *pbVar10;
  byte *pbVar11;
  byte *pbVar12;
  hFILE *phVar13;
  ulong uVar14;
  
  phVar13 = fd->fp;
  pbVar12 = (byte *)phVar13->begin;
  if (pbVar12 < phVar13->end) {
    phVar13->begin = (char *)(pbVar12 + 1);
    uVar14 = (ulong)*pbVar12;
  }
  else {
    uVar8 = hgetc2(phVar13);
    if (uVar8 == 0xffffffff) {
      return -1;
    }
    uVar14 = (ulong)(uVar8 & 0xff);
  }
  iVar5 = 1;
  uVar8 = (uint)uVar14;
  if (0x7f < uVar8) {
    if (uVar8 < 0xc0) {
      phVar13 = fd->fp;
      pbVar12 = (byte *)phVar13->begin;
      if (pbVar12 < phVar13->end) {
        phVar13->begin = (char *)(pbVar12 + 1);
        uVar1 = (uint)*pbVar12;
      }
      else {
        uVar1 = hgetc2(phVar13);
      }
      uVar14 = (ulong)((uVar8 & 0x3f) << 8 | uVar1 & 0xff);
      iVar5 = 2;
    }
    else if (uVar8 < 0xe0) {
      phVar13 = fd->fp;
      pbVar12 = (byte *)phVar13->begin;
      pbVar11 = (byte *)phVar13->end;
      if (pbVar12 < pbVar11) {
        pbVar10 = pbVar12 + 1;
        phVar13->begin = (char *)pbVar10;
        uVar1 = (uint)*pbVar12;
      }
      else {
        uVar1 = hgetc2(phVar13);
        phVar13 = fd->fp;
        pbVar10 = (byte *)phVar13->begin;
        pbVar11 = (byte *)phVar13->end;
      }
      if (pbVar10 < pbVar11) {
        phVar13->begin = (char *)(pbVar10 + 1);
        uVar2 = (uint)*pbVar10;
      }
      else {
        uVar2 = hgetc2(phVar13);
      }
      uVar14 = (ulong)((uVar8 & 0x1f) << 0x10 | (uVar1 & 0xff) << 8 | uVar2 & 0xff);
      iVar5 = 3;
    }
    else if (uVar8 < 0xf0) {
      phVar13 = fd->fp;
      pbVar12 = (byte *)phVar13->begin;
      pbVar11 = (byte *)phVar13->end;
      if (pbVar12 < pbVar11) {
        pbVar10 = pbVar12 + 1;
        phVar13->begin = (char *)pbVar10;
        uVar1 = (uint)*pbVar12;
      }
      else {
        uVar1 = hgetc2(phVar13);
        phVar13 = fd->fp;
        pbVar10 = (byte *)phVar13->begin;
        pbVar11 = (byte *)phVar13->end;
      }
      if (pbVar10 < pbVar11) {
        pbVar12 = pbVar10 + 1;
        phVar13->begin = (char *)pbVar12;
        uVar2 = (uint)*pbVar10;
      }
      else {
        uVar2 = hgetc2(phVar13);
        phVar13 = fd->fp;
        pbVar12 = (byte *)phVar13->begin;
        pbVar11 = (byte *)phVar13->end;
      }
      if (pbVar12 < pbVar11) {
        phVar13->begin = (char *)(pbVar12 + 1);
        uVar3 = (uint)*pbVar12;
      }
      else {
        uVar3 = hgetc2(phVar13);
      }
      uVar14 = (ulong)(((uVar1 & 0xff) << 8 | (uVar8 & 0xf) << 0x10 | uVar2 & 0xff) << 8 |
                      uVar3 & 0xff);
      iVar5 = 4;
    }
    else if (uVar8 < 0xf8) {
      phVar13 = fd->fp;
      pbVar12 = (byte *)phVar13->begin;
      pbVar11 = (byte *)phVar13->end;
      if (pbVar12 < pbVar11) {
        pbVar10 = pbVar12 + 1;
        phVar13->begin = (char *)pbVar10;
        uVar1 = (uint)*pbVar12;
      }
      else {
        uVar1 = hgetc2(phVar13);
        phVar13 = fd->fp;
        pbVar10 = (byte *)phVar13->begin;
        pbVar11 = (byte *)phVar13->end;
      }
      if (pbVar10 < pbVar11) {
        pbVar12 = pbVar10 + 1;
        phVar13->begin = (char *)pbVar12;
        uVar2 = (uint)*pbVar10;
      }
      else {
        uVar2 = hgetc2(phVar13);
        phVar13 = fd->fp;
        pbVar12 = (byte *)phVar13->begin;
        pbVar11 = (byte *)phVar13->end;
      }
      if (pbVar12 < pbVar11) {
        pbVar10 = pbVar12 + 1;
        phVar13->begin = (char *)pbVar10;
        uVar3 = (uint)*pbVar12;
      }
      else {
        uVar3 = hgetc2(phVar13);
        phVar13 = fd->fp;
        pbVar10 = (byte *)phVar13->begin;
        pbVar11 = (byte *)phVar13->end;
      }
      if (pbVar10 < pbVar11) {
        phVar13->begin = (char *)(pbVar10 + 1);
        uVar4 = (uint)*pbVar10;
      }
      else {
        uVar4 = hgetc2(phVar13);
      }
      uVar14 = ((ulong)((uVar1 & 0xff) << 8 | uVar8 << 0x10 | uVar2 & 0xff) & 0x7ffff) << 0x10 |
               (ulong)((uVar3 & 0xff) << 8) | (ulong)(uVar4 & 0xff);
      iVar5 = 5;
    }
    else if (uVar8 < 0xfc) {
      phVar13 = fd->fp;
      pbVar12 = (byte *)phVar13->begin;
      pbVar11 = (byte *)phVar13->end;
      if (pbVar12 < pbVar11) {
        pbVar10 = pbVar12 + 1;
        phVar13->begin = (char *)pbVar10;
        uVar1 = (uint)*pbVar12;
      }
      else {
        uVar1 = hgetc2(phVar13);
        phVar13 = fd->fp;
        pbVar10 = (byte *)phVar13->begin;
        pbVar11 = (byte *)phVar13->end;
      }
      if (pbVar10 < pbVar11) {
        pbVar12 = pbVar10 + 1;
        phVar13->begin = (char *)pbVar12;
        uVar2 = (uint)*pbVar10;
      }
      else {
        uVar2 = hgetc2(phVar13);
        phVar13 = fd->fp;
        pbVar12 = (byte *)phVar13->begin;
        pbVar11 = (byte *)phVar13->end;
      }
      if (pbVar12 < pbVar11) {
        pbVar10 = pbVar12 + 1;
        phVar13->begin = (char *)pbVar10;
        uVar3 = (uint)*pbVar12;
      }
      else {
        uVar3 = hgetc2(phVar13);
        phVar13 = fd->fp;
        pbVar10 = (byte *)phVar13->begin;
        pbVar11 = (byte *)phVar13->end;
      }
      if (pbVar10 < pbVar11) {
        pbVar12 = pbVar10 + 1;
        phVar13->begin = (char *)pbVar12;
        uVar4 = (uint)*pbVar10;
      }
      else {
        uVar4 = hgetc2(phVar13);
        phVar13 = fd->fp;
        pbVar12 = (byte *)phVar13->begin;
        pbVar11 = (byte *)phVar13->end;
      }
      if (pbVar12 < pbVar11) {
        phVar13->begin = (char *)(pbVar12 + 1);
        uVar6 = (uint)*pbVar12;
      }
      else {
        uVar6 = hgetc2(phVar13);
      }
      uVar14 = ((ulong)((uVar3 & 0xff) << 8) |
                ((ulong)((uVar1 & 0xff) << 8 | uVar8 << 0x10 | uVar2 & 0xff) & 0x3ffff) << 0x10 |
               (ulong)(uVar4 & 0xff)) << 8 | (ulong)(uVar6 & 0xff);
      iVar5 = 6;
    }
    else if (uVar8 < 0xfe) {
      phVar13 = fd->fp;
      pbVar12 = (byte *)phVar13->begin;
      pbVar11 = (byte *)phVar13->end;
      if (pbVar12 < pbVar11) {
        pbVar10 = pbVar12 + 1;
        phVar13->begin = (char *)pbVar10;
        uVar1 = (uint)*pbVar12;
      }
      else {
        uVar1 = hgetc2(phVar13);
        phVar13 = fd->fp;
        pbVar10 = (byte *)phVar13->begin;
        pbVar11 = (byte *)phVar13->end;
      }
      if (pbVar10 < pbVar11) {
        pbVar12 = pbVar10 + 1;
        phVar13->begin = (char *)pbVar12;
        uVar2 = (uint)*pbVar10;
      }
      else {
        uVar2 = hgetc2(phVar13);
        phVar13 = fd->fp;
        pbVar12 = (byte *)phVar13->begin;
        pbVar11 = (byte *)phVar13->end;
      }
      if (pbVar12 < pbVar11) {
        pbVar10 = pbVar12 + 1;
        phVar13->begin = (char *)pbVar10;
        uVar3 = (uint)*pbVar12;
      }
      else {
        uVar3 = hgetc2(phVar13);
        phVar13 = fd->fp;
        pbVar10 = (byte *)phVar13->begin;
        pbVar11 = (byte *)phVar13->end;
      }
      if (pbVar10 < pbVar11) {
        pbVar12 = pbVar10 + 1;
        phVar13->begin = (char *)pbVar12;
        uVar4 = (uint)*pbVar10;
      }
      else {
        uVar4 = hgetc2(phVar13);
        phVar13 = fd->fp;
        pbVar12 = (byte *)phVar13->begin;
        pbVar11 = (byte *)phVar13->end;
      }
      if (pbVar12 < pbVar11) {
        pbVar10 = pbVar12 + 1;
        phVar13->begin = (char *)pbVar10;
        uVar6 = (uint)*pbVar12;
      }
      else {
        uVar6 = hgetc2(phVar13);
        phVar13 = fd->fp;
        pbVar10 = (byte *)phVar13->begin;
        pbVar11 = (byte *)phVar13->end;
      }
      if (pbVar10 < pbVar11) {
        phVar13->begin = (char *)(pbVar10 + 1);
        uVar7 = (uint)*pbVar10;
      }
      else {
        uVar7 = hgetc2(phVar13);
      }
      uVar14 = ((ulong)((uVar3 & 0xff) << 8) |
                ((ulong)((uVar1 & 0xff) << 8 | uVar8 << 0x10 | uVar2 & 0xff) & 0x1ffff) << 0x10 |
               (ulong)(uVar4 & 0xff)) << 0x10 | (ulong)((uVar6 & 0xff) << 8) | (ulong)(uVar7 & 0xff)
      ;
      iVar5 = 7;
    }
    else {
      phVar13 = fd->fp;
      pbVar12 = (byte *)phVar13->begin;
      pbVar11 = (byte *)phVar13->end;
      if (uVar8 == 0xff) {
        if (pbVar12 < pbVar11) {
          pbVar10 = pbVar12 + 1;
          phVar13->begin = (char *)pbVar10;
          uVar8 = (uint)*pbVar12;
        }
        else {
          uVar8 = hgetc2(phVar13);
          phVar13 = fd->fp;
          pbVar10 = (byte *)phVar13->begin;
          pbVar11 = (byte *)phVar13->end;
        }
        if (pbVar10 < pbVar11) {
          pbVar12 = pbVar10 + 1;
          phVar13->begin = (char *)pbVar12;
          uVar1 = (uint)*pbVar10;
        }
        else {
          uVar1 = hgetc2(phVar13);
          phVar13 = fd->fp;
          pbVar12 = (byte *)phVar13->begin;
          pbVar11 = (byte *)phVar13->end;
        }
        if (pbVar12 < pbVar11) {
          pbVar10 = pbVar12 + 1;
          phVar13->begin = (char *)pbVar10;
          uVar2 = (uint)*pbVar12;
        }
        else {
          uVar2 = hgetc2(phVar13);
          phVar13 = fd->fp;
          pbVar10 = (byte *)phVar13->begin;
          pbVar11 = (byte *)phVar13->end;
        }
        if (pbVar10 < pbVar11) {
          pbVar12 = pbVar10 + 1;
          phVar13->begin = (char *)pbVar12;
          uVar3 = (uint)*pbVar10;
        }
        else {
          uVar3 = hgetc2(phVar13);
          phVar13 = fd->fp;
          pbVar12 = (byte *)phVar13->begin;
          pbVar11 = (byte *)phVar13->end;
        }
        if (pbVar12 < pbVar11) {
          pbVar10 = pbVar12 + 1;
          phVar13->begin = (char *)pbVar10;
          uVar4 = (uint)*pbVar12;
        }
        else {
          uVar4 = hgetc2(phVar13);
          phVar13 = fd->fp;
          pbVar10 = (byte *)phVar13->begin;
          pbVar11 = (byte *)phVar13->end;
        }
        if (pbVar10 < pbVar11) {
          pbVar12 = pbVar10 + 1;
          phVar13->begin = (char *)pbVar12;
          uVar6 = (uint)*pbVar10;
        }
        else {
          uVar6 = hgetc2(phVar13);
          phVar13 = fd->fp;
          pbVar12 = (byte *)phVar13->begin;
          pbVar11 = (byte *)phVar13->end;
        }
        if (pbVar12 < pbVar11) {
          pbVar10 = pbVar12 + 1;
          phVar13->begin = (char *)pbVar10;
          uVar7 = (uint)*pbVar12;
        }
        else {
          uVar7 = hgetc2(phVar13);
          phVar13 = fd->fp;
          pbVar10 = (byte *)phVar13->begin;
          pbVar11 = (byte *)phVar13->end;
        }
        if (pbVar10 < pbVar11) {
          phVar13->begin = (char *)(pbVar10 + 1);
          uVar9 = (uint)*pbVar10;
        }
        else {
          uVar9 = hgetc2(phVar13);
        }
        uVar14 = ((ulong)((uVar6 & 0xff) << 8) |
                  ((ulong)((uVar3 & 0xff) << 8) |
                   (ulong)(uVar2 & 0xff | (uVar1 & 0xff) << 8 | uVar8 << 0x10) << 0x10 |
                  (ulong)(uVar4 & 0xff)) << 0x10 | (ulong)(uVar7 & 0xff)) << 8 |
                 (ulong)(uVar9 & 0xff);
        iVar5 = 9;
      }
      else {
        if (pbVar12 < pbVar11) {
          pbVar10 = pbVar12 + 1;
          phVar13->begin = (char *)pbVar10;
          uVar8 = (uint)*pbVar12;
        }
        else {
          uVar8 = hgetc2(phVar13);
          phVar13 = fd->fp;
          pbVar10 = (byte *)phVar13->begin;
          pbVar11 = (byte *)phVar13->end;
        }
        if (pbVar10 < pbVar11) {
          pbVar12 = pbVar10 + 1;
          phVar13->begin = (char *)pbVar12;
          uVar1 = (uint)*pbVar10;
        }
        else {
          uVar1 = hgetc2(phVar13);
          phVar13 = fd->fp;
          pbVar12 = (byte *)phVar13->begin;
          pbVar11 = (byte *)phVar13->end;
        }
        if (pbVar12 < pbVar11) {
          pbVar10 = pbVar12 + 1;
          phVar13->begin = (char *)pbVar10;
          uVar2 = (uint)*pbVar12;
        }
        else {
          uVar2 = hgetc2(phVar13);
          phVar13 = fd->fp;
          pbVar10 = (byte *)phVar13->begin;
          pbVar11 = (byte *)phVar13->end;
        }
        if (pbVar10 < pbVar11) {
          pbVar12 = pbVar10 + 1;
          phVar13->begin = (char *)pbVar12;
          uVar3 = (uint)*pbVar10;
        }
        else {
          uVar3 = hgetc2(phVar13);
          phVar13 = fd->fp;
          pbVar12 = (byte *)phVar13->begin;
          pbVar11 = (byte *)phVar13->end;
        }
        if (pbVar12 < pbVar11) {
          pbVar10 = pbVar12 + 1;
          phVar13->begin = (char *)pbVar10;
          uVar4 = (uint)*pbVar12;
        }
        else {
          uVar4 = hgetc2(phVar13);
          phVar13 = fd->fp;
          pbVar10 = (byte *)phVar13->begin;
          pbVar11 = (byte *)phVar13->end;
        }
        if (pbVar10 < pbVar11) {
          pbVar12 = pbVar10 + 1;
          phVar13->begin = (char *)pbVar12;
          uVar6 = (uint)*pbVar10;
        }
        else {
          uVar6 = hgetc2(phVar13);
          phVar13 = fd->fp;
          pbVar12 = (byte *)phVar13->begin;
          pbVar11 = (byte *)phVar13->end;
        }
        if (pbVar12 < pbVar11) {
          phVar13->begin = (char *)(pbVar12 + 1);
          uVar7 = (uint)*pbVar12;
        }
        else {
          uVar7 = hgetc2(phVar13);
        }
        uVar14 = ((ulong)((uVar3 & 0xff) << 8) |
                  (ulong)(uVar2 & 0xff | (uVar1 & 0xff | (uVar8 & 0xff) << 8) << 8) << 0x10 |
                 (ulong)(uVar4 & 0xff)) << 0x10 | (ulong)((uVar6 & 0xff) << 8) |
                 (ulong)(uVar7 & 0xff);
        iVar5 = 8;
      }
    }
  }
  *val_p = uVar14;
  return iVar5;
}

Assistant:

int ltf8_decode(cram_fd *fd, int64_t *val_p) {
    int c = hgetc(fd->fp);
    int64_t val = (unsigned char)c;
    if (c == -1)
	return -1;

    if (val < 0x80) {
	*val_p =   val;
	return 1;

    } else if (val < 0xc0) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & (((1LL<<(6+8)))-1);
	return 2;

    } else if (val < 0xe0) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(5+2*8))-1);
	return 3;

    } else if (val < 0xf0) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(4+3*8))-1);
	return 4;

    } else if (val < 0xf8) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(3+4*8))-1);
	return 5;

    } else if (val < 0xfc) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(2+5*8))-1);
	return 6;

    } else if (val < 0xfe) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(1+6*8))-1);
	return 7;

    } else if (val < 0xff) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(7*8))-1);
	return 8;

    } else {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val;
    }

    return 9;
}